

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.cc
# Opt level: O3

void lrit::to_json(json *j,ImageNavigationHeader *h)

{
  value_t t;
  pointer pcVar1;
  json_value jVar2;
  long lVar3;
  initializer_list_t init;
  initializer_list_t init_00;
  initializer_list_t init_01;
  initializer_list_t init_02;
  initializer_list_t init_03;
  initializer_list_t init_04;
  string projectionName;
  undefined1 *local_260;
  undefined8 local_258;
  undefined1 local_250;
  undefined7 uStack_24f;
  undefined8 uStack_248;
  long *local_240 [2];
  long local_230 [2];
  json_ref<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
  local_220;
  value_t local_200 [8];
  undefined8 *local_1f8;
  value_t *local_1f0;
  undefined1 local_1e8;
  undefined1 local_1e0 [8];
  json_value local_1d8;
  json_ref<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
  local_1d0;
  value_t local_1b0 [8];
  long local_1a8;
  value_t *local_1a0;
  undefined1 local_198;
  json_ref<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
  local_190;
  value_t local_170 [8];
  long local_168;
  value_t *local_160;
  undefined1 local_158;
  json_ref<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
  local_150;
  value_t local_130 [8];
  long local_128;
  value_t *local_120;
  undefined1 local_118;
  json_ref<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
  local_110;
  value_t local_f0 [8];
  long local_e8;
  value_t *local_e0;
  undefined1 local_d8;
  json_ref<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
  local_d0;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  local_b0;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  *local_a0;
  undefined1 local_98;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  local_90;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  *local_80;
  undefined1 local_78;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  local_70;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  *local_60;
  undefined1 local_58;
  undefined1 local_50 [16];
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  *local_40;
  undefined1 local_38;
  
  local_240[0] = local_230;
  pcVar1 = (h->projectionName)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_240,pcVar1,pcVar1 + (h->projectionName)._M_string_length);
  std::__cxx11::string::find((char)(string *)local_240,0x29);
  local_220.owned_value.m_type = string;
  local_220.owned_value.m_value.object =
       (object_t *)
       nlohmann::
       basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
       ::create<std::__cxx11::string,char_const(&)[15]>((char (*) [15])"ProjectionName");
  local_220.value_ref = &local_220.owned_value;
  local_220.is_rvalue = true;
  std::__cxx11::string::substr((ulong)&local_260,(ulong)local_240);
  local_1f8 = (undefined8 *)0x0;
  local_200[0] = string;
  local_1f8 = (undefined8 *)operator_new(0x20);
  local_1f0 = local_200;
  *local_1f8 = local_1f8 + 2;
  if (local_260 == &local_250) {
    local_1f8[2] = CONCAT71(uStack_24f,local_250);
    local_1f8[3] = uStack_248;
  }
  else {
    *local_1f8 = local_260;
    local_1f8[2] = CONCAT71(uStack_24f,local_250);
  }
  local_1f8[1] = local_258;
  local_258 = 0;
  local_250 = 0;
  local_1e8 = 1;
  init._M_len = 2;
  init._M_array = &local_220;
  local_260 = &local_250;
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::basic_json(&local_d0.owned_value,init,true,array);
  local_d0.value_ref = &local_d0.owned_value;
  local_d0.is_rvalue = true;
  local_110.owned_value.m_value.object = (object_t *)0x0;
  local_110.owned_value.m_type = string;
  local_110.owned_value.m_value.object =
       (object_t *)
       nlohmann::
       basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
       ::create<std::__cxx11::string,char_const(&)[14]>((char (*) [14])"ColumnScaling");
  local_110.value_ref = &local_110.owned_value;
  local_110.is_rvalue = true;
  local_e0 = local_f0;
  local_e8 = (long)(int)h->columnScaling;
  local_f0[0] = number_integer;
  local_d8 = 1;
  init_00._M_len = 2;
  init_00._M_array = (iterator)local_110.value_ref;
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::basic_json(&local_b0,init_00,true,array);
  local_98 = 1;
  local_150.owned_value.m_value.object = (object_t *)0x0;
  local_150.owned_value.m_type = string;
  local_a0 = &local_b0;
  local_150.owned_value.m_value.object =
       (object_t *)
       nlohmann::
       basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
       ::create<std::__cxx11::string,char_const(&)[12]>((char (*) [12])"LineScaling");
  local_150.value_ref = &local_150.owned_value;
  local_150.is_rvalue = true;
  local_120 = local_130;
  local_128 = (long)(int)h->lineScaling;
  local_130[0] = number_integer;
  local_118 = 1;
  init_01._M_len = 2;
  init_01._M_array = (iterator)local_150.value_ref;
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::basic_json(&local_90,init_01,true,array);
  local_78 = 1;
  local_190.owned_value.m_value.object = (object_t *)0x0;
  local_190.owned_value.m_type = string;
  local_80 = &local_90;
  local_190.owned_value.m_value.object =
       (object_t *)
       nlohmann::
       basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
       ::create<std::__cxx11::string,char_const(&)[13]>((char (*) [13])"ColumnOffset");
  local_190.value_ref = &local_190.owned_value;
  local_190.is_rvalue = true;
  local_160 = local_170;
  local_168 = (long)(int)h->columnOffset;
  local_170[0] = number_integer;
  local_158 = 1;
  init_02._M_len = 2;
  init_02._M_array = (iterator)local_190.value_ref;
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::basic_json(&local_70,init_02,true,array);
  local_58 = 1;
  local_1d0.owned_value.m_value.object = (object_t *)0x0;
  local_1d0.owned_value.m_type = string;
  local_60 = &local_70;
  local_1d0.owned_value.m_value.object =
       (object_t *)
       nlohmann::
       basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
       ::create<std::__cxx11::string,char_const(&)[11]>((char (*) [11])"LineOffset");
  local_1d0.value_ref = &local_1d0.owned_value;
  local_1d0.is_rvalue = true;
  local_1a0 = local_1b0;
  local_1a8 = (long)(int)h->lineOffset;
  local_1b0[0] = number_integer;
  local_198 = 1;
  init_03._M_len = 2;
  init_03._M_array = (iterator)local_1d0.value_ref;
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                *)local_50,init_03,true,array);
  local_38 = 1;
  init_04._M_len = 5;
  init_04._M_array = &local_d0;
  local_40 = (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
              *)local_50;
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                *)local_1e0,init_04,true,array);
  t = j->m_type;
  j->m_type = local_1e0[0];
  jVar2 = j->m_value;
  j->m_value = local_1d8;
  local_1e0[0] = t;
  local_1d8 = jVar2;
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::json_value::destroy((json_value *)(local_1e0 + 8),t);
  lVar3 = 0;
  do {
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::json_value::destroy((json_value *)(local_50 + lVar3 + 8),local_50[lVar3]);
    lVar3 = lVar3 + -0x20;
  } while (lVar3 != -0xa0);
  lVar3 = 0;
  do {
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::json_value::destroy((json_value *)((long)&local_1a8 + lVar3),local_1b0[lVar3]);
    lVar3 = lVar3 + -0x20;
  } while (lVar3 != -0x40);
  lVar3 = 0;
  do {
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::json_value::destroy((json_value *)((long)&local_168 + lVar3),local_170[lVar3]);
    lVar3 = lVar3 + -0x20;
  } while (lVar3 != -0x40);
  lVar3 = 0;
  do {
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::json_value::destroy((json_value *)((long)&local_128 + lVar3),local_130[lVar3]);
    lVar3 = lVar3 + -0x20;
  } while (lVar3 != -0x40);
  lVar3 = 0;
  do {
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::json_value::destroy((json_value *)((long)&local_e8 + lVar3),local_f0[lVar3]);
    lVar3 = lVar3 + -0x20;
  } while (lVar3 != -0x40);
  lVar3 = 0;
  do {
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::json_value::destroy((json_value *)((long)&local_1f8 + lVar3),local_200[lVar3]);
    lVar3 = lVar3 + -0x20;
  } while (lVar3 != -0x40);
  if (local_260 != &local_250) {
    operator_delete(local_260,CONCAT71(uStack_24f,local_250) + 1);
  }
  if (local_240[0] != local_230) {
    operator_delete(local_240[0],local_230[0] + 1);
  }
  return;
}

Assistant:

void to_json(json& j, const ImageNavigationHeader& h) {
  std::string projectionName(h.projectionName);
  auto rpos = projectionName.find(')');
  j = {
      {"ProjectionName", projectionName.substr(0, rpos + 1)},
      {"ColumnScaling", int(h.columnScaling)},
      {"LineScaling", int(h.lineScaling)},
      {"ColumnOffset", int(h.columnOffset)},
      {"LineOffset", int(h.lineOffset)},
  };
}